

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# none.hpp
# Opt level: O2

error_code __thiscall
websocketpp::transport::asio::basic_socket::connection::init_asio
          (connection *this,io_service_ptr service,strand_ptr *param_2,bool param_3)

{
  error_category *peVar1;
  undefined8 uVar2;
  error_code eVar3;
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_40;
  io_service_ptr local_30;
  __shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (this->m_state == UNINITIALIZED) {
    local_30 = service;
    std::
    make_shared<asio::basic_stream_socket<asio::ip::tcp>,std::reference_wrapper<asio::io_context>>
              ((reference_wrapper<asio::io_context> *)&local_28);
    std::__shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&(this->m_socket).
               super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    if ((this->m_socket_init_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                (&local_40,&(this->m_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
      std::function<void_(std::weak_ptr<void>,_asio::basic_stream_socket<asio::ip::tcp>_&)>::
      operator()(&this->m_socket_init_handler,(weak_ptr<void> *)&local_40,
                 (this->m_socket).
                 super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_40._M_refcount);
    }
    this->m_state = READY;
    uVar2 = 0;
    peVar1 = (error_category *)std::_V2::system_category();
  }
  else {
    uVar2 = 3;
    peVar1 = socket::get_socket_category();
  }
  eVar3._M_cat = peVar1;
  eVar3._0_8_ = uVar2;
  return eVar3;
}

Assistant:

lib::error_code init_asio (io_service_ptr service, strand_ptr, bool)
    {
        if (m_state != UNINITIALIZED) {
            return socket::make_error_code(socket::error::invalid_state);
        }

        m_socket = lib::make_shared<lib::asio::ip::tcp::socket>(
            lib::ref(*service));

        if (m_socket_init_handler) {
            m_socket_init_handler(m_hdl, *m_socket);
        }

        m_state = READY;

        return lib::error_code();
    }